

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O3

bool trun::caseMatch(string *caseName,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *caseList)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  kMatch kVar6;
  pointer pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> negTC;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar7 = (caseList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (caseList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = false;
  if (pbVar7 != pbVar1) {
    bVar4 = bVar3;
    do {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar2 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + pbVar7->_M_string_length);
      iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_70,"-");
      bVar3 = true;
      if (iVar5 == 0) {
        iVar5 = 3;
      }
      else if (*local_70._M_dataplus._M_p == '!') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,&local_70,1,0xffffffffffffffff);
        kVar6 = Glob::Match(&local_50,caseName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (kVar6 == Match) {
          iVar5 = 4;
          bVar3 = false;
        }
        else {
LAB_001250d7:
          iVar5 = 0;
          bVar3 = bVar4;
        }
      }
      else {
        kVar6 = Glob::Match(&local_70,caseName);
        iVar5 = 4;
        if (kVar6 != Match) goto LAB_001250d7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    } while (((iVar5 == 3) || (iVar5 == 0)) &&
            (pbVar7 = pbVar7 + 1, bVar4 = bVar3, pbVar7 != pbVar1));
  }
  return bVar3;
}

Assistant:

bool caseMatch(const std::string &caseName, const std::vector<std::string> &caseList) {
        int executeFlag = 0;
        for (auto tc: caseList) {
            if (tc == "-") {
                executeFlag = 1;
                continue;
            }
            if (tc[0]=='!') {
                auto negTC = tc.substr(1);
                auto isMatch = trun::match(caseName, negTC);
                if (isMatch) {
                    executeFlag = 0;
                    goto leave;
                }
            } else {
                auto isMatch = trun::match(caseName, tc);
                if (isMatch) {
                    executeFlag = 1;
                    goto leave;
                }
            }
        }
        leave:
            return executeFlag?true:false;
    }